

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O3

void __thiscall ktx::ValidationContext::validateKVD(ValidationContext *this)

{
  string *psVar1;
  short *psVar2;
  size_type sVar3;
  pointer pKVar4;
  size_type sVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  bool bVar7;
  uint *__s;
  KeyValueEntry *pKVar8;
  _Alloc_hider *p_Var9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  KeyValueEntry *pKVar11;
  iterator iVar12;
  int iVar13;
  ulong uVar14;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var15;
  code *pcVar16;
  __buckets_ptr end;
  __buckets_ptr extraout_RDX;
  offset_in_KeyValueEntry_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  *poVar17;
  offset_in_KeyValueEntry_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  *extraout_RDX_01;
  KeyValueEntry *entry;
  char **ppcVar18;
  pointer pKVar19;
  uint uVar20;
  ulong uVar21;
  ktx_uint8_t *pkVar23;
  IssueError *pIVar24;
  __normal_iterator<KeyValueEntry_*,_std::vector<KeyValueEntry,_std::allocator<KeyValueEntry>_>_>
  __i;
  uint *puVar25;
  uint *ptr;
  __normal_iterator<KeyValueEntry_*,_std::vector<KeyValueEntry,_std::allocator<KeyValueEntry>_>_>
  __last;
  uint uVar26;
  long lVar27;
  uint *puVar28;
  long lVar29;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar30;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_KhronosGroup[P]KTX_Software_tools_ktx_utility_h:124:58)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_KhronosGroup[P]KTX_Software_tools_ktx_utility_h:124:58)>
  __comp_00;
  _Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_KhronosGroup[P]KTX_Software_tools_ktx_utility_h:124:58)>
  __comp_01;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_KhronosGroup[P]KTX_Software_tools_ktx_utility_h:124:58)>
  __comp_02;
  pair<std::__detail::_Node_iterator<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>,_bool>
  pVar31;
  uint32_t sizeKeyValuePair;
  vector<KeyValueEntry,_std::allocator<KeyValueEntry>_> entries;
  ktx_uint32_t kvdByteLength;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>_>_>
  kvValidators;
  long remainingKVDBytes;
  unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  keys;
  uint local_10c;
  code *local_108;
  undefined8 local_100;
  vector<KeyValueEntry,_std::allocator<KeyValueEntry>_> local_f8;
  uint32_t local_e0;
  uint local_dc;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_d8;
  __buckets_ptr local_a0;
  uint *local_98;
  char **local_90;
  int local_84;
  ulong local_80;
  long local_78;
  uint *local_70;
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  offset_in_KeyValueEntry_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  *extraout_RDX_00;
  ulong uVar22;
  
  uVar14 = (ulong)(this->header).keyValueData.byteOffset;
  local_dc = (this->header).keyValueData.byteLength;
  if (local_dc != 0 && uVar14 != 0) {
    uVar21 = (ulong)local_dc;
    __s = (uint *)operator_new__(uVar21);
    memset(__s,0,uVar21);
    pIVar24 = (IssueError *)0x12;
    local_98 = __s;
    (*this->_vptr_ValidationContext[2])(this,uVar14,__s,uVar21,0x12,"the Key/Value Data");
    puVar28 = (uint *)((ulong)local_dc + (long)__s);
    local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
    super__Vector_impl_data._M_start = (KeyValueEntry *)0x0;
    local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
    super__Vector_impl_data._M_finish = (KeyValueEntry *)0x0;
    local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (KeyValueEntry *)0x0;
    local_68._M_buckets = &local_68._M_single_bucket;
    local_68._M_bucket_count = 1;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    puVar25 = __s;
    if ((ulong)local_dc != 0) {
      iVar13 = 0;
      ptr = puVar28;
      local_70 = puVar28;
      do {
        local_78 = (long)ptr - (long)puVar25;
        puVar28 = ptr;
        if (iVar13 == 100) {
          local_d8._M_buckets = (__buckets_ptr)CONCAT44(local_d8._M_buckets._4_4_,100);
          warning<unsigned_int,long_const&>
                    (this,&Metadata::TooManyEntries,(uint *)&local_d8,&local_78);
          goto LAB_001a984e;
        }
        if (local_78 < 6) {
          error<long_const&>(this,&Metadata::NotEnoughDataForAnEntry,&local_78);
          goto LAB_001a984e;
        }
        local_10c = *puVar25;
        uVar14 = (ulong)local_10c;
        local_84 = iVar13;
        if (uVar14 < 2) {
          error<unsigned_int&>(this,&Metadata::KeyAndValueByteLengthTooSmall,&local_10c);
        }
        else {
          ppcVar18 = (char **)(puVar25 + 1);
          if (ptr < (uint *)(uVar14 + (long)ppcVar18)) {
            local_d8._M_buckets = (__buckets_ptr)((long)ptr - (long)ppcVar18);
            error<unsigned_int&,long_const&>
                      (this,&Metadata::KeyAndValueByteLengthTooLarge,&local_10c,(long *)&local_d8);
            uVar14 = (ulong)local_d8._M_buckets & 0xffffffff;
            local_10c = (uint)local_d8._M_buckets;
            if ((uint)local_d8._M_buckets != 0) goto LAB_001a9459;
          }
          else {
LAB_001a9459:
            uVar26 = (uint)uVar14;
            uVar21 = 0;
            do {
              uVar22 = uVar21;
              if (*(char *)((long)ppcVar18 + uVar21) == '\0') break;
              uVar21 = uVar21 + 1;
              uVar22 = uVar14;
            } while (uVar14 != uVar21);
            uVar20 = (uint)uVar22;
            if (uVar20 != 0) {
              local_e0 = ~uVar20 + uVar26;
              local_a0 = (__buckets_ptr)(uVar22 & 0xffffffff);
              if (uVar20 == uVar26) {
                local_e0 = 0;
              }
              end = local_a0;
              local_d8._M_buckets = local_a0;
              local_d8._M_bucket_count = (size_type)ppcVar18;
              if ((2 < uVar20) &&
                 (*(char *)((long)puVar25 + 6) == -0x41 && *(short *)ppcVar18 == -0x4411)) {
                local_d8._M_bucket_count = (long)puVar25 + 7;
                local_d8._M_buckets = (__buckets_ptr)((long)local_a0 - 3);
                error<std::basic_string_view<char,std::char_traits<char>>&>
                          (this,&Metadata::KeyForbiddenBOM,
                           (basic_string_view<char,_std::char_traits<char>_> *)&local_d8);
                end = local_a0;
              }
              sVar5 = local_d8._M_bucket_count;
              local_a0 = (__buckets_ptr)((char *)((long)ppcVar18 + (long)end) + 1);
              ppcVar18 = (char **)((long)local_d8._M_buckets + local_d8._M_bucket_count);
              local_90 = (char **)local_d8._M_bucket_count;
              do {
                if (local_90 == ppcVar18) goto LAB_001a9567;
                bVar7 = advanceUTF8<char_const*>((ktx *)&local_90,ppcVar18,(char *)end);
                end = extraout_RDX;
              } while (bVar7);
              local_108 = (code *)((long)local_90 - sVar5);
              local_100 = CONCAT71(local_100._1_7_,1);
              error<std::basic_string_view<char,std::char_traits<char>>&,unsigned_long&>
                        (this,&Metadata::KeyInvalidUTF8,
                         (basic_string_view<char,_std::char_traits<char>_> *)&local_d8,
                         (unsigned_long *)&local_108);
LAB_001a9567:
              if (uVar20 == uVar26) {
                error<std::basic_string_view<char,std::char_traits<char>>&>
                          (this,&Metadata::KeyMissingNullTerminator,
                           (basic_string_view<char,_std::char_traits<char>_> *)&local_d8);
              }
              pKVar19 = local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
              pKVar4 = local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              if (local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl
                  .super__Vector_impl_data._M_finish ==
                  local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage) {
                if ((long)local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start == 0x7fffffffffffffe0) {
                  std::__throw_length_error("vector::_M_realloc_insert");
                }
                lVar27 = (long)local_f8.
                               super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_f8.
                               super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 4;
                uVar21 = lVar27 * -0x5555555555555555;
                uVar14 = uVar21;
                if (local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
                  uVar14 = 1;
                }
                local_80 = uVar14 + uVar21;
                if (0x2aaaaaaaaaaaaa9 < local_80) {
                  local_80 = 0x2aaaaaaaaaaaaaa;
                }
                if (CARRY8(uVar14,uVar21)) {
                  local_80 = 0x2aaaaaaaaaaaaaa;
                }
                if (local_80 == 0) {
                  pKVar8 = (KeyValueEntry *)0x0;
                }
                else {
                  pKVar8 = (KeyValueEntry *)operator_new(local_80 * 0x30);
                }
                psVar1 = (string *)(&(pKVar8->key)._M_dataplus + lVar27 * 2);
                p_Var9 = &(pKVar8->key)._M_dataplus + lVar27 * 2;
                p_Var9->_M_p = (pointer)(p_Var9 + 2);
                std::__cxx11::string::_M_construct<char_const*>
                          (psVar1,local_d8._M_bucket_count,
                           (char *)((long)local_d8._M_buckets + local_d8._M_bucket_count));
                uVar14 = local_80;
                *(__buckets_ptr *)(psVar1 + 0x20) = local_a0;
                *(uint32_t *)(psVar1 + 0x28) = local_e0;
                pKVar11 = pKVar8;
                if (pKVar19 != pKVar4) {
                  paVar10 = &(pKVar4->key).field_2;
                  paVar6 = &(pKVar8->key).field_2;
                  do {
                    paVar30 = paVar6;
                    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      **)(paVar30->_M_local_buf + -0x10) = paVar30;
                    if (paVar10 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*(size_type **)(paVar10->_M_local_buf + -0x10)) {
                      sVar3 = *(size_type *)(paVar10->_M_local_buf + 8);
                      paVar30->_M_allocated_capacity = paVar10->_M_allocated_capacity;
                      *(size_type *)(paVar30->_M_local_buf + 8) = sVar3;
                    }
                    else {
                      *(size_type **)(paVar30->_M_local_buf + -0x10) =
                           *(size_type **)(paVar10->_M_local_buf + -0x10);
                      paVar30->_M_allocated_capacity = paVar10->_M_allocated_capacity;
                    }
                    *(size_type *)(paVar30->_M_local_buf + -8) =
                         *(size_type *)(paVar10->_M_local_buf + -8);
                    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      **)(paVar10->_M_local_buf + -0x10) = paVar10;
                    *(size_type *)(paVar10->_M_local_buf + -8) = 0;
                    paVar10->_M_local_buf[0] = '\0';
                    *(int *)(paVar30->_M_local_buf + 0x18) =
                         (int)*(size_type *)(paVar10->_M_local_buf + 0x18);
                    *(size_type *)(paVar30->_M_local_buf + 0x10) =
                         *(size_type *)(paVar10->_M_local_buf + 0x10);
                    pKVar11 = (KeyValueEntry *)(paVar10->_M_local_buf + 0x20);
                    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(paVar10->_M_local_buf + 0x30);
                    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)(paVar30->_M_local_buf + 0x30);
                  } while (pKVar11 != pKVar19);
                  pKVar11 = (KeyValueEntry *)(paVar30->_M_local_buf + 0x20);
                }
                if (pKVar4 != (KeyValueEntry *)0x0) {
                  operator_delete(pKVar4,(long)local_f8.
                                               super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                         (long)pKVar4);
                }
                local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = pKVar8 + uVar14;
                local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
                super__Vector_impl_data._M_start = pKVar8;
              }
              else {
                ((local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl
                  .super__Vector_impl_data._M_finish)->key)._M_dataplus._M_p =
                     (pointer)&((local_f8.
                                 super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>.
                                 _M_impl.super__Vector_impl_data._M_finish)->key).field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)
                           local_f8.
                           super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl
                           .super__Vector_impl_data._M_finish,local_d8._M_bucket_count,
                           (char *)((long)local_d8._M_buckets + local_d8._M_bucket_count));
                pKVar19->data = (uint8_t *)local_a0;
                pKVar19->size = local_e0;
                pKVar11 = pKVar19;
              }
              local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
              super__Vector_impl_data._M_finish = pKVar11 + 1;
              pVar31 = std::
                       _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                       ::_M_emplace<std::basic_string_view<char,std::char_traits<char>>&>
                                 ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                   *)&local_68,&local_d8);
              __s = local_98;
              puVar28 = local_70;
              if (((undefined1  [16])pVar31 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                error<std::basic_string_view<char,std::char_traits<char>>&>
                          (this,&Metadata::DuplicateKey,
                           (basic_string_view<char,_std::char_traits<char>_> *)&local_d8);
                __s = local_98;
                puVar28 = local_70;
              }
              goto LAB_001a97a2;
            }
          }
          __s = local_98;
          error<>(this,&Metadata::KeyEmpty);
        }
LAB_001a97a2:
        uVar26 = local_10c;
        pIVar24 = &Metadata::PaddingNotZero;
        validateAlignmentPaddingZeros<char_const(&)[24]>
                  (this,(void *)((long)puVar25 + (ulong)local_10c + 4),puVar28,4,
                   &Metadata::PaddingNotZero,(char (*) [24])"after a Key-Value entry");
        iVar13 = local_84 + 1;
        puVar25 = (uint *)((long)puVar25 + (ulong)uVar26 + 7 & 0xfffffffffffffffc);
        ptr = puVar28;
      } while (puVar25 < puVar28);
    }
    ptr = puVar25;
    if (puVar25 != puVar28) {
      local_d8._M_buckets = (__buckets_ptr)((long)puVar25 - (long)__s);
      error<long,unsigned_int_const&>(this,&Metadata::SizesDontAddUp,(long *)&local_d8,&local_dc);
    }
LAB_001a984e:
    if ((this->header).supercompressionGlobalData.byteLength != 0) {
      pIVar24 = &Metadata::PaddingNotZero;
      validateAlignmentPaddingZeros<char_const(&)[25]>
                (this,ptr,puVar28,8,&Metadata::PaddingNotZero,
                 (char (*) [25])"after the last KVD entry");
    }
    pKVar4 = local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pKVar8 = local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        pKVar8 = pKVar8 + 1;
        if (pKVar8 == pKVar4) goto LAB_001a996b;
        iVar13 = std::__cxx11::string::compare((string *)pKVar8);
      } while (-1 < iVar13);
    }
    if (pKVar8 != pKVar4) {
      error<>(this,&Metadata::OutOfOrder);
      pKVar19 = local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pKVar4 = local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_d8._M_buckets = (__buckets_ptr)0x0;
      if (local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        lVar29 = (long)local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        uVar14 = (lVar29 >> 4) * -0x5555555555555555;
        lVar27 = 0x3f;
        if (uVar14 != 0) {
          for (; uVar14 >> lVar27 == 0; lVar27 = lVar27 + -1) {
          }
        }
        p_Var15 = &local_d8;
        __comp_02._M_comp.proj =
             (offset_in_KeyValueEntry_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              *)pIVar24;
        __comp_02._M_comp.comp = (less<void> *)p_Var15;
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<ktx::ValidationContext::validateKVD()::KeyValueEntry*,std::vector<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<ktx::sort<std::vector<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>,std::less<void>,std::__cxx11::string_ktx::ValidationContext::validateKVD()::KeyValueEntry::*>(std::vector<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>&,std::less<void>&&,std::__cxx11::string_ktx::ValidationContext::validateKVD()::KeyValueEntry::*&&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  ((__normal_iterator<KeyValueEntry_*,_std::vector<KeyValueEntry,_std::allocator<KeyValueEntry>_>_>
                    )local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<KeyValueEntry_*,_std::vector<KeyValueEntry,_std::allocator<KeyValueEntry>_>_>
                    )local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                   (ulong)(((uint)lVar27 ^ 0x3f) * 2) ^ 0x7e,__comp_02);
        if (lVar29 < 0x301) {
          __comp_00._M_comp.proj =
               (offset_in_KeyValueEntry_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                *)p_Var15;
          __comp_00._M_comp.comp = (less<void> *)&local_d8;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<ktx::ValidationContext::validateKVD()::KeyValueEntry*,std::vector<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>>,__gnu_cxx::__ops::_Iter_comp_iter<ktx::sort<std::vector<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>,std::less<void>,std::__cxx11::string_ktx::ValidationContext::validateKVD()::KeyValueEntry::*>(std::vector<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>&,std::less<void>&&,std::__cxx11::string_ktx::ValidationContext::validateKVD()::KeyValueEntry::*&&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    ((__normal_iterator<KeyValueEntry_*,_std::vector<KeyValueEntry,_std::allocator<KeyValueEntry>_>_>
                      )pKVar4,(__normal_iterator<KeyValueEntry_*,_std::vector<KeyValueEntry,_std::allocator<KeyValueEntry>_>_>
                               )pKVar19,__comp_00);
        }
        else {
          __last._M_current = pKVar4 + 0x10;
          __comp._M_comp.proj =
               (offset_in_KeyValueEntry_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                *)p_Var15;
          __comp._M_comp.comp = (less<void> *)&local_d8;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<ktx::ValidationContext::validateKVD()::KeyValueEntry*,std::vector<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>>,__gnu_cxx::__ops::_Iter_comp_iter<ktx::sort<std::vector<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>,std::less<void>,std::__cxx11::string_ktx::ValidationContext::validateKVD()::KeyValueEntry::*>(std::vector<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>&,std::less<void>&&,std::__cxx11::string_ktx::ValidationContext::validateKVD()::KeyValueEntry::*&&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    ((__normal_iterator<KeyValueEntry_*,_std::vector<KeyValueEntry,_std::allocator<KeyValueEntry>_>_>
                      )pKVar4,__last,__comp);
          if (__last._M_current != pKVar19) {
            poVar17 = extraout_RDX_00;
            do {
              __comp_01._M_comp.proj = poVar17;
              __comp_01._M_comp.comp = (less<void> *)&local_d8;
              std::
              __unguarded_linear_insert<__gnu_cxx::__normal_iterator<ktx::ValidationContext::validateKVD()::KeyValueEntry*,std::vector<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>>,__gnu_cxx::__ops::_Val_comp_iter<ktx::sort<std::vector<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>,std::less<void>,std::__cxx11::string_ktx::ValidationContext::validateKVD()::KeyValueEntry::*>(std::vector<ktx::ValidationContext::validateKVD()::KeyValueEntry,std::allocator<ktx::ValidationContext::validateKVD()::KeyValueEntry>>&,std::less<void>&&,std::__cxx11::string_ktx::ValidationContext::validateKVD()::KeyValueEntry::*&&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                        (__last,__comp_01);
              __last._M_current = __last._M_current + 1;
              poVar17 = extraout_RDX_01;
            } while (__last._M_current != pKVar19);
          }
        }
      }
    }
LAB_001a996b:
    local_d8._M_buckets = &local_d8._M_single_bucket;
    local_d8._M_bucket_count = 1;
    local_d8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_d8._M_element_count = 0;
    local_d8._M_rehash_policy._M_max_load_factor = 1.0;
    local_d8._M_rehash_policy._M_next_resize = 0;
    local_d8._M_single_bucket = (__node_base_ptr)0x0;
    local_108 = validateKTXcubemapIncomplete;
    local_100 = 0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<char_const(&)[21],void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_d8,"KTXcubemapIncomplete");
    local_108 = validateKTXorientation;
    local_100 = 0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<char_const(&)[15],void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_d8,"KTXorientation");
    local_108 = validateKTXglFormat;
    local_100 = 0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<char_const(&)[12],void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_d8,"KTXglFormat");
    local_108 = validateKTXdxgiFormat;
    local_100 = 0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<char_const(&)[16],void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_d8,"KTXdxgiFormat__");
    local_108 = validateKTXmetalPixelFormat;
    local_100 = 0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<char_const(&)[20],void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_d8,"KTXmetalPixelFormat");
    local_108 = validateKTXswizzle;
    local_100 = 0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<char_const(&)[11],void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_d8,"KTXswizzle");
    local_108 = validateKTXwriter;
    local_100 = 0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<char_const(&)[10],void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_d8,"KTXwriter");
    local_108 = validateKTXwriterScParams;
    local_100 = 0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<char_const(&)[18],void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_d8,"KTXwriterScParams");
    local_108 = validateKTXastcDecodeMode;
    local_100 = 0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<char_const(&)[18],void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_d8,"KTXastcDecodeMode");
    local_108 = validateKTXanimData;
    local_100 = 0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<char_const(&)[12],void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>,std::allocator<std::pair<std::__cxx11::string_const,void(ktx::ValidationContext::*)(unsigned_char_const*,unsigned_int)>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_d8,"KTXanimData");
    pKVar4 = local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pKVar19 = local_f8.super__Vector_base<KeyValueEntry,_std::allocator<KeyValueEntry>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        iVar12 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&local_d8,&pKVar19->key);
        if (iVar12.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_true>
            ._M_cur == (__node_type *)0x0) {
          if (((pKVar19->key)._M_string_length < 3) ||
             ((psVar2 = (short *)(pKVar19->key)._M_dataplus._M_p,
              (char)psVar2[1] != 'X' || *psVar2 != 0x544b &&
              ((char)psVar2[1] != 'x' || *psVar2 != 0x746b)))) {
            warning<std::__cxx11::string_const&>(this,&Metadata::CustomMetadata,&pKVar19->key);
          }
          else {
            error<std::__cxx11::string_const&>(this,&Metadata::UnknownReservedKey,&pKVar19->key);
          }
        }
        else {
          pcVar16 = *(code **)((long)iVar12.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_true>
                                     ._M_cur + 0x28);
          pkVar23 = (this->header).identifier +
                    *(long *)((long)iVar12.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_true>
                                    ._M_cur + 0x30) + -0x38;
          if (((ulong)pcVar16 & 1) != 0) {
            pcVar16 = *(code **)(pcVar16 + *(long *)pkVar23 + -1);
          }
          (*pcVar16)(pkVar23,pKVar19->data,pKVar19->size);
        }
        pKVar19 = pKVar19 + 1;
      } while (pKVar19 != pKVar4);
    }
    if ((this->foundKTXanimData != false) && (this->foundKTXcubemapIncomplete == true)) {
      error<>(this,&Metadata::KTXanimDataWithCubeIncomplete);
    }
    if (this->foundKTXwriter == false) {
      if (this->foundKTXwriterScParams == true) {
        error<>(this,&Metadata::KTXwriterRequiredButMissing);
      }
      else {
        warning<>(this,&Metadata::KTXwriterMissing);
      }
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(ktx::ValidationContext::*)(const_unsigned_char_*,_unsigned_int)>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_d8);
    std::
    _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_68);
    std::vector<KeyValueEntry,_std::allocator<KeyValueEntry>_>::~vector(&local_f8);
    operator_delete__(__s);
  }
  return;
}

Assistant:

void ValidationContext::validateKVD() {
    const auto kvdByteOffset = header.keyValueData.byteOffset;
    const auto kvdByteLength = header.keyValueData.byteLength;

    if (kvdByteOffset == 0 || kvdByteLength == 0)
        return; // There is no KVD block

    const auto buffer = std::make_unique<uint8_t[]>(kvdByteLength);
    read(kvdByteOffset, buffer.get(), kvdByteLength, "the Key/Value Data");
    const auto* ptrKVD = buffer.get();
    const auto* ptrKVDEnd = ptrKVD + kvdByteLength;

    struct KeyValueEntry {
        std::string key;
        const uint8_t* data;
        uint32_t size;

        KeyValueEntry(std::string_view key, const uint8_t* data, uint32_t size) :
                key(key), data(data), size(size) {}
    };
    std::vector<KeyValueEntry> entries;
    std::unordered_set<std::string_view> keys;

    uint32_t numKVEntry = 0;
    // Process Key-Value entries {size, key, \0, value} until the end of the KVD block
    // Where size is an uint32_t, and it equals to: sizeof(key) + 1 + sizeof(value)
    const auto* ptrEntry = ptrKVD;
    while (ptrEntry < ptrKVDEnd) {
        const auto remainingKVDBytes = ptrKVDEnd - ptrEntry;

        if (++numKVEntry > MAX_NUM_KV_ENTRIES) {
            warning(Metadata::TooManyEntries, numKVEntry - 1, remainingKVDBytes);
            ptrEntry = ptrKVDEnd;
            break;
        }

        if (remainingKVDBytes < 6) {
            error(Metadata::NotEnoughDataForAnEntry, remainingKVDBytes);
            ptrEntry = ptrKVDEnd;
            break;
        }

        uint32_t sizeKeyValuePair;
        std::memcpy(&sizeKeyValuePair, ptrEntry, sizeof(uint32_t));

        const auto* ptrKeyValuePair = ptrEntry + sizeof(uint32_t);
        const auto* ptrKey = ptrKeyValuePair;

        if (sizeKeyValuePair < 2) {
            error(Metadata::KeyAndValueByteLengthTooSmall, sizeKeyValuePair);
        } else {
            if (ptrKeyValuePair + sizeKeyValuePair > ptrKVDEnd) {
                const auto bytesLeft = ptrKVDEnd - ptrKeyValuePair;
                error(Metadata::KeyAndValueByteLengthTooLarge, sizeKeyValuePair, bytesLeft);
                sizeKeyValuePair = static_cast<uint32_t>(bytesLeft); // Attempt recovery to read out at least the key
            }

            // Determine key, finding the null terminator
            uint32_t sizeKey = 0;
            while (sizeKey < sizeKeyValuePair && ptrKey[sizeKey] != '\0')
                ++sizeKey;

            if (sizeKey == 0) {
                error(Metadata::KeyEmpty);
            } else {
                const auto keyHasNullTerminator = sizeKey != sizeKeyValuePair;
                auto key = std::string_view(reinterpret_cast<const char*>(ptrKey), sizeKey);

                // Determine the value
                const auto* ptrValue = ptrKey + sizeKey + 1;
                const auto sizeValue = keyHasNullTerminator ? sizeKeyValuePair - sizeKey - 1 : 0;

                // Check for BOM
                if (starts_with(key, "\xEF\xBB\xBF")) {
                    key.remove_prefix(3);
                    error(Metadata::KeyForbiddenBOM, key);
                }

                if (auto invalidIndex = validateUTF8(key))
                    error(Metadata::KeyInvalidUTF8, key, *invalidIndex);

                if (!keyHasNullTerminator)
                    error(Metadata::KeyMissingNullTerminator, key);

                entries.emplace_back(key, ptrValue, sizeValue);

                if (!keys.emplace(key).second)
                    error(Metadata::DuplicateKey, key);
            }
        }

        // Finish entry
        ptrEntry += sizeof(uint32_t) + sizeKeyValuePair;
        validateAlignmentPaddingZeros(ptrEntry, ptrKVDEnd, 4, Metadata::PaddingNotZero, "after a Key-Value entry");
        ptrEntry = align(ptrEntry, 4);
    }

    if (ptrEntry != ptrKVDEnd)
        // Being super explicit about the specs. This check might be overkill as other checks often cover this case
        error(Metadata::SizesDontAddUp, ptrEntry - ptrKVD, kvdByteLength);

    if (header.supercompressionGlobalData.byteLength != 0)
        validateAlignmentPaddingZeros(ptrEntry, ptrKVDEnd, 8, Metadata::PaddingNotZero, "after the last KVD entry");

    if (!is_sorted(entries, std::less<>{}, &KeyValueEntry::key)) {
        error(Metadata::OutOfOrder);
        sort(entries, std::less<>{}, &KeyValueEntry::key);
    }

    using MemberFN = void(ValidationContext::*)(const uint8_t*, uint32_t);
    std::unordered_map<std::string, MemberFN> kvValidators;

    kvValidators.emplace("KTXcubemapIncomplete", &ValidationContext::validateKTXcubemapIncomplete);
    kvValidators.emplace("KTXorientation", &ValidationContext::validateKTXorientation);
    kvValidators.emplace("KTXglFormat", &ValidationContext::validateKTXglFormat);
    kvValidators.emplace("KTXdxgiFormat__", &ValidationContext::validateKTXdxgiFormat);
    kvValidators.emplace("KTXmetalPixelFormat", &ValidationContext::validateKTXmetalPixelFormat);
    kvValidators.emplace("KTXswizzle", &ValidationContext::validateKTXswizzle);
    kvValidators.emplace("KTXwriter", &ValidationContext::validateKTXwriter);
    kvValidators.emplace("KTXwriterScParams", &ValidationContext::validateKTXwriterScParams);
    kvValidators.emplace("KTXastcDecodeMode", &ValidationContext::validateKTXastcDecodeMode);
    kvValidators.emplace("KTXanimData", &ValidationContext::validateKTXanimData);

    for (const auto& entry : entries) {
        const auto it = kvValidators.find(entry.key);
        if (it != kvValidators.end()) {
            (this->*it->second)(entry.data, entry.size);
        } else {
            if (starts_with(entry.key, "KTX") || starts_with(entry.key, "ktx"))
                error(Metadata::UnknownReservedKey, entry.key);
            else
                warning(Metadata::CustomMetadata, entry.key);
        }
    }

    if (foundKTXanimData && foundKTXcubemapIncomplete)
        error(Metadata::KTXanimDataWithCubeIncomplete);

    if (!foundKTXwriter) {
        if (foundKTXwriterScParams)
            error(Metadata::KTXwriterRequiredButMissing);
        else
            warning(Metadata::KTXwriterMissing);
    }
}